

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void __thiscall duckdb_parquet::DataPageHeader::printTo(DataPageHeader *this,ostream *out)

{
  ostream *poVar1;
  type *val;
  type *val_00;
  type *val_01;
  string local_40;
  
  std::operator<<(out,"DataPageHeader(");
  poVar1 = std::operator<<(out,"num_values=");
  duckdb_apache::thrift::to_string<int>(&local_40,&this->num_values);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  poVar1 = std::operator<<(out,", ");
  poVar1 = std::operator<<(poVar1,"encoding=");
  to_string_abi_cxx11_(&local_40,(duckdb_parquet *)&this->encoding,val);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  poVar1 = std::operator<<(out,", ");
  poVar1 = std::operator<<(poVar1,"definition_level_encoding=");
  to_string_abi_cxx11_(&local_40,(duckdb_parquet *)&this->definition_level_encoding,val_00);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  poVar1 = std::operator<<(out,", ");
  poVar1 = std::operator<<(poVar1,"repetition_level_encoding=");
  to_string_abi_cxx11_(&local_40,(duckdb_parquet *)&this->repetition_level_encoding,val_01);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  poVar1 = std::operator<<(out,", ");
  std::operator<<(poVar1,"statistics=");
  if (((byte)this->__isset & 1) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::Statistics>(&local_40,&this->statistics);
    std::operator<<(out,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  std::operator<<(out,")");
  return;
}

Assistant:

void DataPageHeader::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "DataPageHeader(";
  out << "num_values=" << to_string(num_values);
  out << ", " << "encoding=" << to_string(encoding);
  out << ", " << "definition_level_encoding=" << to_string(definition_level_encoding);
  out << ", " << "repetition_level_encoding=" << to_string(repetition_level_encoding);
  out << ", " << "statistics="; (__isset.statistics ? (out << to_string(statistics)) : (out << "<null>"));
  out << ")";
}